

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_parserInternals(void)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  undefined8 uVar16;
  xmlParserCtxtPtr pxVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 uVar22;
  undefined4 uVar23;
  undefined8 uVar24;
  int test_ret_7;
  uint *puVar25;
  int n_lang;
  uint uVar26;
  xmlChar *pxVar27;
  ulong uVar28;
  undefined8 uVar29;
  char *pcVar30;
  undefined *puVar31;
  int n_len_1;
  undefined8 *puVar32;
  undefined **ppuVar33;
  int n_val;
  uint uVar34;
  undefined4 uVar35;
  char *pcVar36;
  int test_ret_15;
  uint uVar37;
  undefined4 *puVar38;
  int *piVar39;
  int n_size;
  bool bVar40;
  int test_ret_3;
  int test_ret_1;
  int test_ret_2;
  int test_ret;
  int test_ret_9;
  int test_ret_19;
  int test_ret_20;
  int test_ret_21;
  int test_ret_22;
  uint local_80;
  int local_7c;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  
  if (quiet == '\0') {
    puts("Testing parserInternals : 28 of 75 functions ...");
  }
  puVar32 = &DAT_00159d60;
  uVar26 = 0;
  iVar13 = 0;
  do {
    iVar2 = xmlMemBlocks();
    if (uVar26 < 4) {
      uVar16 = *puVar32;
    }
    else {
      uVar16 = 0;
    }
    xmlCheckLanguageID(uVar16);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCheckLanguageID",(ulong)(uint)(iVar3 - iVar2));
      iVar13 = iVar13 + 1;
      printf(" %d",(ulong)uVar26);
      putchar(10);
    }
    uVar26 = uVar26 + 1;
    puVar32 = puVar32 + 1;
  } while (uVar26 != 5);
  function_tests = function_tests + 1;
  local_7c = 0;
  uVar26 = 0;
  do {
    uVar28 = 0;
    do {
      uVar20 = 0;
      iVar2 = (int)uVar28;
      pxVar27 = (xmlChar *)0x0;
      if (iVar2 == 0) {
        pxVar27 = chartab;
      }
      puVar38 = &DAT_00157174;
      do {
        iVar3 = xmlMemBlocks();
        uVar23 = 0xffffffff;
        uVar35 = 0xffffffff;
        if (uVar26 < 4) {
          uVar35 = (&DAT_00157174)[uVar26];
        }
        if ((uint)uVar20 < 4) {
          uVar23 = *puVar38;
        }
        xmlCopyChar(uVar35,pxVar27,uVar23);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCopyChar",(ulong)(uint)(iVar4 - iVar3));
          local_7c = local_7c + 1;
          printf(" %d",(ulong)uVar26);
          printf(" %d",uVar28);
          printf(" %d",uVar20);
          putchar(10);
        }
        uVar34 = (uint)uVar20 + 1;
        uVar20 = (ulong)uVar34;
        puVar38 = puVar38 + 1;
      } while (uVar34 != 4);
      uVar28 = (ulong)(iVar2 + 1);
    } while (iVar2 == 0);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 4);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar26 = 0;
  do {
    pxVar27 = (xmlChar *)0x0;
    if (uVar26 == 0) {
      pxVar27 = chartab;
    }
    puVar38 = &DAT_00157174;
    uVar28 = 0;
    do {
      iVar3 = xmlMemBlocks();
      uVar35 = 0xffffffff;
      if ((uint)uVar28 < 4) {
        uVar35 = *puVar38;
      }
      xmlCopyCharMultiByte(pxVar27,uVar35);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyCharMultiByte",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar26);
        printf(" %d",uVar28);
        putchar(10);
      }
      uVar34 = (uint)uVar28 + 1;
      uVar28 = (ulong)uVar34;
      puVar38 = puVar38 + 1;
    } while (uVar34 != 4);
    bVar40 = uVar26 == 0;
    uVar26 = uVar26 + 1;
  } while (bVar40);
  function_tests = function_tests + 1;
  local_80 = 0;
  uVar26 = 0;
  do {
    uVar28 = 0;
    do {
      uVar34 = 0;
      puVar32 = &DAT_00159d60;
      do {
        iVar3 = xmlMemBlocks();
        if (uVar26 < 4) {
          uVar16 = (&DAT_00159d60)[uVar26];
        }
        else {
          uVar16 = 0;
        }
        if ((uint)uVar28 < 4) {
          uVar29 = (&DAT_00159d60)[uVar28];
        }
        else {
          uVar29 = 0;
        }
        if (uVar34 < 4) {
          uVar24 = *puVar32;
        }
        else {
          uVar24 = 0;
        }
        xmlCreateEntityParserCtxt(uVar16,uVar29,uVar24);
        xmlFreeParserCtxt();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCreateEntityParserCtxt",(ulong)(uint)(iVar4 - iVar3)
                );
          local_80 = local_80 + 1;
          printf(" %d",(ulong)uVar26);
          printf(" %d",uVar28);
          printf(" %d");
          putchar(10);
        }
        uVar34 = uVar34 + 1;
        puVar32 = puVar32 + 1;
      } while (uVar34 != 5);
      uVar34 = (uint)uVar28 + 1;
      uVar28 = (ulong)uVar34;
    } while (uVar34 != 5);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 5);
  function_tests = function_tests + 1;
  ppuVar33 = &PTR_anon_var_dwarf_677_00159d20;
  uVar26 = 0;
  iVar3 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar26 < 5) {
      puVar31 = *ppuVar33;
    }
    else {
      puVar31 = (undefined *)0x0;
    }
    xmlCreateFileParserCtxt(puVar31);
    xmlFreeParserCtxt();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCreateFileParserCtxt",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d",(ulong)uVar26);
      putchar(10);
    }
    uVar26 = uVar26 + 1;
    ppuVar33 = ppuVar33 + 1;
  } while (uVar26 != 6);
  function_tests = function_tests + 1;
  uVar26 = 0;
  iVar4 = 0;
  do {
    piVar39 = &DAT_00157174;
    uVar28 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar26 == 0) {
        bVar40 = false;
        pcVar36 = "foo";
      }
      else if (uVar26 == 2) {
        bVar40 = false;
        pcVar36 = "test/ent2";
      }
      else if (uVar26 == 1) {
        bVar40 = false;
        pcVar36 = "<foo/>";
      }
      else {
        bVar40 = true;
        pcVar36 = (char *)0x0;
      }
      iVar7 = -1;
      if ((uint)uVar28 < 4) {
        iVar7 = *piVar39;
      }
      if ((!bVar40) && (iVar6 = xmlStrlen(pcVar36), iVar6 < iVar7)) {
        iVar7 = 0;
      }
      uVar16 = xmlCreateMemoryParserCtxt(pcVar36,iVar7);
      xmlFreeParserCtxt(uVar16);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar5 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCreateMemoryParserCtxt",(ulong)(uint)(iVar7 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar26);
        printf(" %d",uVar28);
        putchar(10);
      }
      uVar34 = (uint)uVar28 + 1;
      uVar28 = (ulong)uVar34;
      piVar39 = piVar39 + 1;
    } while (uVar34 != 4);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 4);
  function_tests = function_tests + 1;
  iVar13 = local_7c + iVar13 + iVar2 + local_80;
  iVar2 = 0;
  uVar26 = 0;
  do {
    puVar25 = &DAT_00157174;
    uVar34 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar26 < 5) {
        puVar31 = (&PTR_anon_var_dwarf_677_00159d20)[uVar26];
      }
      else {
        puVar31 = (undefined *)0x0;
      }
      pcVar36 = (char *)0xffffffff;
      if (uVar34 < 4) {
        pcVar36 = (char *)(ulong)*puVar25;
      }
      xmlCreateURLParserCtxt(puVar31);
      xmlFreeParserCtxt();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar5 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCreateURLParserCtxt",(ulong)(uint)(iVar7 - iVar5));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar26);
        pcVar36 = (char *)(ulong)uVar34;
        printf(" %d");
        putchar(10);
      }
      uVar34 = uVar34 + 1;
      puVar25 = puVar25 + 1;
    } while (uVar34 != 4);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 6);
  function_tests = function_tests + 1;
  uVar26 = 0;
  iVar5 = 0;
  do {
    iVar7 = xmlMemBlocks();
    pxVar17 = gen_xmlParserCtxtPtr(uVar26,(int)pcVar36);
    xmlCtxtErrMemory(pxVar17);
    call_tests = call_tests + 1;
    if (pxVar17 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar17);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar7 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtErrMemory",(ulong)(uint)(iVar6 - iVar7));
      iVar5 = iVar5 + 1;
      pcVar36 = (char *)(ulong)uVar26;
      printf(" %d");
      putchar(10);
    }
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  function_tests = function_tests + 1;
  uVar26 = 0;
  iVar7 = 0;
  do {
    iVar6 = xmlMemBlocks();
    pxVar17 = gen_xmlParserCtxtPtr(uVar26,(int)pcVar36);
    uVar16 = xmlCtxtPopInput(pxVar17);
    xmlFreeInputStream(uVar16);
    call_tests = call_tests + 1;
    if (pxVar17 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar17);
    }
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar6 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtPopInput",(ulong)(uint)(iVar8 - iVar6));
      iVar7 = iVar7 + 1;
      pcVar36 = (char *)(ulong)uVar26;
      printf(" %d");
      putchar(10);
    }
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  iVar8 = 0;
  do {
    iVar10 = (int)pcVar36;
    iVar9 = xmlMemBlocks();
    pxVar17 = gen_xmlParserCtxtPtr(iVar8,iVar10);
    pcVar36 = (char *)0x0;
    xmlCtxtPushInput(pxVar17);
    call_tests = call_tests + 1;
    if (pxVar17 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar17);
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtPushInput",(ulong)(uint)(iVar10 - iVar9));
      iVar6 = iVar6 + 1;
      printf(" %d");
      pcVar36 = (char *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 3);
  function_tests = function_tests + 1;
  local_80 = 0;
  uVar26 = 0;
  do {
    uVar34 = 0;
    do {
      iVar9 = (int)pcVar36;
      iVar8 = xmlMemBlocks();
      pxVar17 = gen_xmlParserCtxtPtr(uVar26,iVar9);
      pcVar36 = (char *)0x0;
      if (uVar34 == 0) {
        pcVar36 = (char *)0x15c404;
      }
      xmlCurrentChar(pxVar17);
      call_tests = call_tests + 1;
      if (pxVar17 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar17);
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCurrentChar",(ulong)(uint)(iVar9 - iVar8));
        local_80 = local_80 + 1;
        printf(" %d",(ulong)uVar26);
        pcVar36 = (char *)(ulong)uVar34;
        printf(" %d");
        putchar(10);
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 == 1);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  function_tests = function_tests + 1;
  puVar38 = &DAT_00157174;
  uVar26 = 0;
  iVar8 = 0;
  do {
    iVar9 = xmlMemBlocks();
    uVar35 = 0xffffffff;
    if (uVar26 < 4) {
      uVar35 = *puVar38;
    }
    xmlIsLetter(uVar35);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsLetter",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      pcVar36 = (char *)(ulong)uVar26;
      printf(" %d");
      putchar(10);
    }
    uVar26 = uVar26 + 1;
    puVar38 = puVar38 + 1;
  } while (uVar26 != 4);
  function_tests = function_tests + 1;
  iVar9 = 0;
  iVar10 = 0;
  do {
    iVar12 = (int)pcVar36;
    iVar11 = xmlMemBlocks();
    pxVar17 = gen_xmlParserCtxtPtr(iVar10,iVar12);
    pcVar36 = (char *)0x0;
    uVar16 = xmlNewEntityInputStream(pxVar17);
    xmlFreeInputStream(uVar16);
    call_tests = call_tests + 1;
    if (pxVar17 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar17);
    }
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewEntityInputStream",(ulong)(uint)(iVar12 - iVar11));
      iVar9 = iVar9 + 1;
      printf(" %d");
      pcVar36 = (char *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar10 = iVar10 + 1;
  } while (iVar10 != 3);
  iVar13 = iVar13 + iVar3 + iVar4 + iVar2 + iVar5 + iVar7 + iVar6 + local_80;
  function_tests = function_tests + 1;
  local_80 = 0;
  uVar26 = 0;
  do {
    puVar32 = &DAT_00159d80;
    pcVar30 = (char *)0x0;
    do {
      iVar3 = (int)pcVar36;
      iVar2 = xmlMemBlocks();
      pxVar17 = gen_xmlParserCtxtPtr(uVar26,iVar3);
      uVar34 = (uint)pcVar30;
      if (uVar34 < 7) {
        pcVar36 = (char *)*puVar32;
      }
      else {
        pcVar36 = (char *)0x0;
      }
      uVar16 = xmlNewInputFromFile(pxVar17);
      xmlFreeInputStream(uVar16);
      call_tests = call_tests + 1;
      if (pxVar17 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar17);
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewInputFromFile",(ulong)(uint)(iVar3 - iVar2));
        local_80 = local_80 + 1;
        printf(" %d",(ulong)uVar26);
        printf(" %d");
        putchar(10);
        pcVar36 = pcVar30;
      }
      uVar34 = uVar34 + 1;
      pcVar30 = (char *)(ulong)uVar34;
      puVar32 = puVar32 + 1;
    } while (uVar34 != 8);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  function_tests = function_tests + 1;
  uVar26 = 0;
  iVar2 = 0;
  do {
    iVar3 = xmlMemBlocks();
    pxVar17 = gen_xmlParserCtxtPtr(uVar26,(int)pcVar36);
    uVar16 = xmlNewInputStream(pxVar17);
    xmlFreeInputStream(uVar16);
    call_tests = call_tests + 1;
    if (pxVar17 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar17);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewInputStream",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      pcVar36 = (char *)(ulong)uVar26;
      printf(" %d");
      putchar(10);
    }
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar26 = 0;
  do {
    puVar32 = &DAT_00159d60;
    pcVar30 = (char *)0x0;
    do {
      iVar5 = (int)pcVar36;
      iVar4 = xmlMemBlocks();
      pxVar17 = gen_xmlParserCtxtPtr(uVar26,iVar5);
      uVar34 = (uint)pcVar30;
      if (uVar34 < 4) {
        pcVar36 = (char *)*puVar32;
      }
      else {
        pcVar36 = (char *)0x0;
      }
      uVar16 = xmlNewStringInputStream(pxVar17);
      xmlFreeInputStream(uVar16);
      call_tests = call_tests + 1;
      if (pxVar17 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar17);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewStringInputStream",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar26);
        printf(" %d");
        putchar(10);
        pcVar36 = pcVar30;
      }
      uVar34 = uVar34 + 1;
      pcVar30 = (char *)(ulong)uVar34;
      puVar32 = puVar32 + 1;
    } while (uVar34 != 5);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  iVar4 = iVar13 + iVar8 + iVar9 + local_80;
  function_tests = function_tests + 1;
  uVar26 = 0;
  iVar13 = 0;
  do {
    iVar5 = xmlMemBlocks();
    pxVar17 = gen_xmlParserCtxtPtr(uVar26,(int)pcVar36);
    xmlNextChar(pxVar17);
    call_tests = call_tests + 1;
    if (pxVar17 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar17);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar5 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNextChar",(ulong)(uint)(iVar7 - iVar5));
      iVar13 = iVar13 + 1;
      pcVar36 = (char *)(ulong)uVar26;
      printf(" %d");
      putchar(10);
    }
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  xmlParserInputShrink(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar5 != iVar7) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlParserInputShrink");
    pcVar36 = (char *)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar26 = 0;
  iVar6 = 0;
  do {
    iVar8 = xmlMemBlocks();
    pxVar17 = gen_xmlParserCtxtPtr(uVar26,(int)pcVar36);
    xmlPopInput(pxVar17);
    call_tests = call_tests + 1;
    if (pxVar17 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar17);
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPopInput",(ulong)(uint)(iVar9 - iVar8));
      iVar6 = iVar6 + 1;
      pcVar36 = (char *)(ulong)uVar26;
      printf(" %d");
      putchar(10);
    }
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  function_tests = function_tests + 1;
  local_80 = 0;
  iVar8 = 0;
  do {
    iVar10 = (int)pcVar36;
    iVar9 = xmlMemBlocks();
    pxVar17 = gen_xmlParserCtxtPtr(iVar8,iVar10);
    pcVar36 = (char *)0x0;
    xmlPushInput(pxVar17);
    call_tests = call_tests + 1;
    if (pxVar17 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar17);
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPushInput",(ulong)(uint)(iVar10 - iVar9));
      local_80 = local_80 + 1;
      printf(" %d");
      pcVar36 = (char *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 3);
  function_tests = function_tests + 1;
  local_60 = 0;
  uVar26 = 0;
  do {
    puVar32 = &DAT_00159d60;
    uVar34 = 0;
    do {
      iVar9 = (int)pcVar36;
      iVar8 = xmlMemBlocks();
      pxVar17 = gen_xmlParserCtxtPtr(uVar26,iVar9);
      if (uVar34 < 4) {
        pcVar36 = (char *)*puVar32;
      }
      else {
        pcVar36 = (char *)0x0;
      }
      lVar18 = xmlSplitQName(pxVar17,pcVar36,0);
      if (lVar18 != 0) {
        (*_xmlFree)(lVar18);
      }
      call_tests = call_tests + 1;
      if (pxVar17 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar17);
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSplitQName",(ulong)(uint)(iVar9 - iVar8));
        local_60 = local_60 + 1;
        printf(" %d",(ulong)uVar26);
        printf(" %d");
        pcVar36 = (char *)0x0;
        printf(" %d");
        putchar(10);
      }
      uVar34 = uVar34 + 1;
      puVar32 = puVar32 + 1;
    } while (uVar34 != 5);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  function_tests = function_tests + 1;
  local_5c = 0;
  uVar26 = 0;
  do {
    uVar28 = 0;
    do {
      pcVar30 = (char *)0x0;
      do {
        iVar9 = (int)pcVar36;
        iVar8 = xmlMemBlocks();
        pxVar17 = gen_xmlParserCtxtPtr(uVar26,iVar9);
        if ((uint)uVar28 < 4) {
          pcVar36 = (char *)(&DAT_00159d60)[uVar28];
        }
        else {
          pcVar36 = (char *)0x0;
        }
        iVar9 = (int)pcVar30;
        uVar16 = 0;
        if (iVar9 == 0) {
          uVar16 = 0x15c408;
        }
        xmlStringCurrentChar(pxVar17,pcVar36,uVar16);
        call_tests = call_tests + 1;
        if (pxVar17 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar17);
        }
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar8 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStringCurrentChar",(ulong)(uint)(iVar10 - iVar8));
          local_5c = local_5c + 1;
          printf(" %d",(ulong)uVar26);
          printf(" %d",uVar28);
          printf(" %d");
          putchar(10);
          pcVar36 = pcVar30;
        }
        uVar34 = iVar9 + 1;
        pcVar30 = (char *)(ulong)uVar34;
      } while (uVar34 == 1);
      uVar34 = (uint)uVar28 + 1;
      uVar28 = (ulong)uVar34;
    } while (uVar34 != 5);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  function_tests = function_tests + 1;
  iVar13 = iVar4 + iVar2 + iVar3 + iVar13 + (uint)(iVar5 != iVar7) + iVar6 + local_80;
  local_58 = 0;
  local_80 = 0;
  do {
    uVar28 = 0;
    do {
      uVar20 = 0;
      do {
        uVar21 = 0;
        do {
          uVar26 = 0xf82061 >> ((char)uVar21 * '\b' & 0x1fU);
          if (2 < (uint)uVar21) {
            uVar26 = 0;
          }
          uVar19 = 0;
          do {
            uVar22 = (char)(0xf82061 >> ((char)uVar19 * '\b' & 0x1fU));
            if (2 < (uint)uVar19) {
              uVar22 = 0;
            }
            pcVar30 = (char *)0x0;
            do {
              iVar3 = (int)pcVar36;
              iVar2 = xmlMemBlocks();
              pxVar17 = gen_xmlParserCtxtPtr(local_80,iVar3);
              if ((uint)uVar28 < 4) {
                pcVar36 = (char *)(&DAT_00159d60)[uVar28];
              }
              else {
                pcVar36 = (char *)0x0;
              }
              uVar35 = 0xffffffff;
              if ((uint)uVar20 < 4) {
                uVar35 = (&DAT_00157174)[uVar20];
              }
              uVar34 = (uint)pcVar30;
              uVar1 = (undefined1)(0xf82061 >> ((char)pcVar30 * '\b' & 0x1fU));
              if (2 < uVar34) {
                uVar1 = 0;
              }
              lVar18 = xmlStringDecodeEntities(pxVar17,pcVar36,uVar35,uVar26 & 0xff,uVar22,uVar1);
              if (lVar18 != 0) {
                (*_xmlFree)(lVar18);
              }
              call_tests = call_tests + 1;
              if (pxVar17 != (xmlParserCtxtPtr)0x0) {
                xmlFreeParserCtxt(pxVar17);
              }
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar2 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlStringDecodeEntities",
                       (ulong)(uint)(iVar3 - iVar2));
                local_58 = local_58 + 1;
                printf(" %d",(ulong)local_80);
                printf(" %d",uVar28);
                printf(" %d",uVar20);
                printf(" %d",uVar21);
                printf(" %d",uVar19);
                printf(" %d");
                putchar(10);
                pcVar36 = pcVar30;
              }
              uVar34 = uVar34 + 1;
              pcVar30 = (char *)(ulong)uVar34;
            } while (uVar34 != 4);
            uVar34 = (uint)uVar19 + 1;
            uVar19 = (ulong)uVar34;
          } while (uVar34 != 4);
          uVar26 = (uint)uVar21 + 1;
          uVar21 = (ulong)uVar26;
        } while (uVar26 != 4);
        uVar26 = (uint)uVar20 + 1;
        uVar20 = (ulong)uVar26;
      } while (uVar26 != 4);
      uVar26 = (uint)uVar28 + 1;
      uVar28 = (ulong)uVar26;
    } while (uVar26 != 5);
    local_80 = local_80 + 1;
  } while (local_80 != 3);
  function_tests = function_tests + 1;
  local_54 = 0;
  uVar26 = 0;
  do {
    uVar28 = 0;
    do {
      uVar34 = 0;
      do {
        uVar15 = 0;
        do {
          uVar20 = 0;
          do {
            uVar22 = (undefined1)(0xf82061 >> ((char)uVar20 * '\b' & 0x1fU));
            if (2 < (uint)uVar20) {
              uVar22 = 0;
            }
            uVar21 = 0;
            do {
              uVar1 = (undefined1)(0xf82061 >> ((char)uVar21 * '\b' & 0x1fU));
              pcVar30 = (char *)0x0;
              if (2 < (uint)uVar21) {
                uVar1 = 0;
              }
              do {
                iVar3 = (int)pcVar36;
                iVar2 = xmlMemBlocks();
                pxVar17 = gen_xmlParserCtxtPtr(uVar26,iVar3);
                switch(uVar28) {
                case 0:
                  bVar40 = false;
                  pcVar36 = "foo";
                  break;
                case 1:
                  bVar40 = false;
                  pcVar36 = "<foo/>";
                  break;
                case 2:
                  bVar40 = false;
                  pcVar36 = anon_var_dwarf_197;
                  break;
                case 3:
                  bVar40 = false;
                  pcVar36 = " 2ab ";
                  break;
                default:
                  bVar40 = true;
                  pcVar36 = (char *)0x0;
                }
                uVar35 = 0xffffffff;
                iVar3 = -1;
                if (uVar34 < 4) {
                  iVar3 = (&DAT_00157174)[uVar34];
                }
                if (uVar15 < 4) {
                  uVar35 = (&DAT_00157174)[uVar15];
                }
                uVar37 = (uint)pcVar30;
                uVar14 = 0xf82061 >> ((char)pcVar30 * '\b' & 0x1fU);
                if (2 < uVar37) {
                  uVar14 = 0;
                }
                if ((!bVar40) && (iVar4 = xmlStrlen(pcVar36), iVar4 < iVar3)) {
                  iVar3 = 0;
                }
                lVar18 = xmlStringLenDecodeEntities
                                   (pxVar17,pcVar36,iVar3,uVar35,uVar22,uVar1,uVar14 & 0xff);
                if (lVar18 != 0) {
                  (*_xmlFree)(lVar18);
                }
                call_tests = call_tests + 1;
                if (pxVar17 != (xmlParserCtxtPtr)0x0) {
                  xmlFreeParserCtxt(pxVar17);
                }
                xmlResetLastError();
                iVar3 = xmlMemBlocks();
                if (iVar2 != iVar3) {
                  iVar3 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlStringLenDecodeEntities",
                         (ulong)(uint)(iVar3 - iVar2));
                  local_54 = local_54 + 1;
                  printf(" %d",(ulong)uVar26);
                  printf(" %d",uVar28);
                  printf(" %d",(ulong)uVar34);
                  printf(" %d",(ulong)uVar15);
                  printf(" %d",uVar20);
                  printf(" %d",uVar21);
                  printf(" %d");
                  putchar(10);
                  pcVar36 = pcVar30;
                }
                uVar37 = uVar37 + 1;
                pcVar30 = (char *)(ulong)uVar37;
              } while (uVar37 != 4);
              uVar14 = (uint)uVar21 + 1;
              uVar21 = (ulong)uVar14;
            } while (uVar14 != 4);
            uVar14 = (uint)uVar20 + 1;
            uVar20 = (ulong)uVar14;
          } while (uVar14 != 4);
          uVar15 = uVar15 + 1;
        } while (uVar15 != 4);
        uVar34 = uVar34 + 1;
      } while (uVar34 != 4);
      uVar34 = (int)uVar28 + 1;
      uVar28 = (ulong)uVar34;
    } while (uVar34 != 5);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  function_tests = function_tests + 1;
  local_80 = 0;
  uVar26 = 0;
  do {
    puVar25 = &DAT_0014b234;
    pcVar30 = (char *)0x0;
    do {
      iVar3 = (int)pcVar36;
      iVar2 = xmlMemBlocks();
      pxVar17 = gen_xmlParserCtxtPtr(uVar26,iVar3);
      pcVar36 = (char *)0xffffffff;
      uVar34 = (uint)pcVar30;
      if (uVar34 < 3) {
        pcVar36 = (char *)(ulong)*puVar25;
      }
      xmlSwitchEncoding(pxVar17);
      call_tests = call_tests + 1;
      if (pxVar17 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar17);
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSwitchEncoding",(ulong)(uint)(iVar3 - iVar2));
        local_80 = local_80 + 1;
        printf(" %d",(ulong)uVar26);
        printf(" %d");
        putchar(10);
        pcVar36 = pcVar30;
      }
      uVar34 = uVar34 + 1;
      pcVar30 = (char *)(ulong)uVar34;
      puVar25 = puVar25 + 1;
    } while (uVar34 != 4);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar26 = 0;
  do {
    puVar32 = &DAT_00159d48;
    pcVar30 = (char *)0x0;
    do {
      iVar4 = (int)pcVar36;
      iVar3 = xmlMemBlocks();
      pxVar17 = gen_xmlParserCtxtPtr(uVar26,iVar4);
      uVar34 = (uint)pcVar30;
      if (uVar34 < 3) {
        pcVar36 = (char *)*puVar32;
      }
      else {
        pcVar36 = (char *)0x0;
      }
      xmlSwitchEncodingName(pxVar17);
      call_tests = call_tests + 1;
      if (pxVar17 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar17);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSwitchEncodingName",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar26);
        printf(" %d");
        putchar(10);
        pcVar36 = pcVar30;
      }
      uVar34 = uVar34 + 1;
      pcVar30 = (char *)(ulong)uVar34;
      puVar32 = puVar32 + 1;
    } while (uVar34 != 4);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  local_54 = iVar13 + local_60 + local_5c + local_58 + local_54;
  function_tests = function_tests + 1;
  iVar13 = 0;
  uVar26 = 0;
  do {
    iVar3 = local_54;
    iVar4 = xmlMemBlocks();
    pxVar17 = gen_xmlParserCtxtPtr(uVar26,iVar3);
    xmlSwitchInputEncoding(pxVar17,0,0);
    call_tests = call_tests + 1;
    if (pxVar17 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar17);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar4 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSwitchInputEncoding",(ulong)(uint)(iVar3 - iVar4));
      iVar13 = iVar13 + 1;
      printf(" %d",(ulong)uVar26);
      printf(" %d",0);
      printf(" %d",0);
      putchar(10);
    }
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  local_54 = local_54 + local_80;
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar26 = 0;
  do {
    iVar4 = local_54;
    iVar5 = xmlMemBlocks();
    pxVar17 = gen_xmlParserCtxtPtr(uVar26,iVar4);
    xmlSwitchToEncoding(pxVar17,0);
    call_tests = call_tests + 1;
    if (pxVar17 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar17);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar5 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSwitchToEncoding",(ulong)(uint)(iVar4 - iVar5));
      iVar3 = iVar3 + 1;
      printf(" %d",(ulong)uVar26);
      printf(" %d",0);
      putchar(10);
    }
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  function_tests = function_tests + 1;
  iVar3 = local_54 + iVar2 + iVar13 + iVar3;
  if (iVar3 != 0) {
    printf("Module parserInternals: %d errors\n");
  }
  return iVar3;
}

Assistant:

static int
test_parserInternals(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing parserInternals : 28 of 75 functions ...\n");
    test_ret += test_xmlCheckLanguageID();
    test_ret += test_xmlCopyChar();
    test_ret += test_xmlCopyCharMultiByte();
    test_ret += test_xmlCreateEntityParserCtxt();
    test_ret += test_xmlCreateFileParserCtxt();
    test_ret += test_xmlCreateMemoryParserCtxt();
    test_ret += test_xmlCreateURLParserCtxt();
    test_ret += test_xmlCtxtErrMemory();
    test_ret += test_xmlCtxtPopInput();
    test_ret += test_xmlCtxtPushInput();
    test_ret += test_xmlCurrentChar();
    test_ret += test_xmlIsLetter();
    test_ret += test_xmlNewEntityInputStream();
    test_ret += test_xmlNewInputFromFile();
    test_ret += test_xmlNewInputStream();
    test_ret += test_xmlNewStringInputStream();
    test_ret += test_xmlNextChar();
    test_ret += test_xmlParserInputShrink();
    test_ret += test_xmlPopInput();
    test_ret += test_xmlPushInput();
    test_ret += test_xmlSplitQName();
    test_ret += test_xmlStringCurrentChar();
    test_ret += test_xmlStringDecodeEntities();
    test_ret += test_xmlStringLenDecodeEntities();
    test_ret += test_xmlSwitchEncoding();
    test_ret += test_xmlSwitchEncodingName();
    test_ret += test_xmlSwitchInputEncoding();
    test_ret += test_xmlSwitchToEncoding();

    if (test_ret != 0)
	printf("Module parserInternals: %d errors\n", test_ret);
    return(test_ret);
}